

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

bool __thiscall CAPSFile::DecodeData(CAPSFile *this,DataChunks item,IDisk *disk)

{
  uint *puVar1;
  uchar byte;
  byte bVar2;
  byte bVar3;
  uint track;
  pointer paVar4;
  pointer paVar5;
  IDisk *this_00;
  int iVar6;
  uint index;
  undefined8 uVar7;
  undefined4 extraout_var;
  MFMTrack *pMVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uchar *puVar22;
  bool bVar23;
  undefined8 local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 local_90;
  IDisk *local_88;
  uint local_80;
  int local_7c;
  byte *local_78;
  uint local_70;
  undefined4 local_6c;
  uchar *local_68;
  MFMTrack **local_60;
  CAPSFile *local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uchar *local_40;
  uchar *local_38;
  
  local_80 = item.size;
  if (item.size == 0) {
    return true;
  }
  paVar4 = (this->list_imge_).
           super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar5 = (this->list_imge_).
           super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar4 != paVar5) {
    local_68 = item.buffer;
    while( true ) {
      puVar1 = &paVar4->data_key;
      if (*puVar1 == item.data_id) break;
      if (paVar4 + 1 == paVar5) {
        return false;
      }
      paVar4 = paVar4 + 1;
      if (*puVar1 == item.data_id) {
        return false;
      }
    }
    local_50 = paVar4->block_count;
    if (local_50 << 5 <= item.size) {
      if (local_50 == 0) {
        return true;
      }
      track = paVar4->track_number;
      local_98 = (long)paVar4->side;
      index = paVar4->start_bit_pos;
      local_60 = &disk->side_[local_98].tracks;
      local_44 = 0;
      local_48 = 0;
      local_88 = disk;
      local_58 = this;
      do {
        if (local_58->encoder_type_ == 1) {
          uVar11 = 0;
        }
        else {
          uVar20 = *(uint *)(local_68 + (ulong)local_44 + 8);
          uVar11 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
        }
        local_4c = *(uint *)(local_68 + (ulong)local_44 + 4);
        byte = local_68[(ulong)local_44 + 0x1b];
        local_78 = (byte *)(ulong)local_68[(ulong)local_44 + 0x1f];
        bVar16 = local_68[(ulong)local_44 + 0x1e];
        bVar2 = local_68[(ulong)local_44 + 0x1d];
        bVar3 = local_68[(ulong)local_44 + 0x1c];
        puVar22 = local_68 + uVar11;
        local_6c = 0;
        uVar7 = 0;
        local_a8 = 0;
        local_a0 = 0;
        local_70 = (uint)local_68[(ulong)local_44 + 0x17];
        if ((local_68[(ulong)local_44 + 0x17] & 1) != 0) {
          iVar6 = (*local_58->_vptr_CAPSFile[8])
                            (local_58,&local_a0,puVar22,&local_6c,(ulong)local_80);
          uVar7 = CONCAT44(extraout_var,iVar6);
        }
        local_90 = uVar7;
        if ((local_70 & 2) == 0) {
          local_7c = 0;
        }
        else {
          local_7c = (*local_58->_vptr_CAPSFile[8])
                               (local_58,&local_a8,puVar22,&local_6c,(ulong)local_80);
        }
        iVar6 = (int)local_78;
        local_78 = local_68 +
                   (int)((uint)bVar16 * 0x100 + iVar6 | (uint)bVar2 * 0x10000 |
                        (uint)bVar3 * 0x1000000);
        bVar9 = *local_78;
        if (bVar9 != 0) {
          local_40 = local_68 +
                     (int)((uint)bVar16 * 0x100 + iVar6 +
                          (uint)bVar3 * 0x1000000 + (uint)bVar2 * 0x10000);
          iVar6 = 1;
          do {
            if (0x1f < bVar9) {
              bVar16 = bVar9 & 0x1f;
              pbVar15 = local_40 + iVar6;
              iVar13 = (uint)(bVar9 >> 5) * 8 + -8;
              iVar14 = 0;
              do {
                iVar19 = iVar14;
                iVar21 = (uint)*pbVar15 << ((byte)iVar13 & 0x1f);
                iVar14 = iVar21 + iVar19;
                pbVar15 = pbVar15 + 1;
                iVar13 = iVar13 + -8;
              } while (iVar13 != -8);
              iVar6 = iVar6 + (uint)(bVar9 >> 5);
              if ((local_70 & 4) == 0) {
                if (bVar16 == 5) {
                  if (0 < iVar14) {
                    iVar13 = 0;
                    do {
                      if ((iVar13 < 0x1001) && (iVar14 == 0x200)) {
                        index = IDisk::AddByteToSpecificTrack
                                          (local_88,(int)local_98,track,index,0xe5,0x10);
                        iVar13 = iVar13 + 0xf;
                      }
                      else {
                        uVar11 = (ulong)index;
                        index = index + 1;
                        (*local_60)[(int)track].bitfield[uVar11] = '\x04';
                        if ((*local_60)[(int)track].size <= index) {
                          index = 0;
                        }
                      }
                      iVar13 = iVar13 + 1;
                    } while (SBORROW4(iVar13,iVar14 * 0x10) != iVar13 + iVar14 * -0x10 < 0);
                  }
                }
                else if (0 < iVar14) {
                  local_38 = local_40 + iVar6;
                  lVar10 = 0;
                  do {
                    if (bVar16 == 1) {
                      index = IDisk::AddMFMByteToAllTrack
                                        (local_88,(int)local_98,track,index,local_38[lVar10],8);
                    }
                    else {
                      index = IDisk::AddByteToSpecificTrack
                                        (local_88,(int)local_98,track,index,local_38[lVar10],0x10);
                    }
                    lVar10 = lVar10 + 1;
                  } while (iVar21 + iVar19 != (int)lVar10);
                  iVar6 = iVar6 + (int)lVar10;
                }
              }
              else {
                for (; iVar14 != 0; iVar14 = iVar14 + -8) {
                  if (bVar16 == 5) {
                    if (0 < iVar14) {
                      pMVar8 = *local_60;
                      iVar13 = 0;
                      do {
                        uVar11 = (ulong)index;
                        index = index + 1;
                        pMVar8[(int)track].bitfield[uVar11] = '\x04';
                        pMVar8 = *local_60;
                        if (pMVar8[(int)track].size <= index) {
                          index = 0;
                        }
                        iVar13 = iVar13 + 1;
                      } while (iVar14 != iVar13);
                    }
                    break;
                  }
                  iVar13 = iVar6 + 1;
                  bVar2 = local_78[iVar6];
                  iVar6 = iVar13;
                  if (bVar16 == 1) {
                    if (iVar14 < 9) {
                      if (0 < iVar14) {
                        pMVar8 = *local_60;
                        uVar20 = 7;
                        do {
                          uVar11 = (ulong)index;
                          index = index + 1;
                          pMVar8[(int)track].bitfield[uVar11] = (bVar2 >> (uVar20 & 0x1f) & 1) != 0;
                          pMVar8 = *local_60;
                          if (pMVar8[(int)track].size <= index) {
                            index = 0;
                          }
                          iVar13 = iVar14 + uVar20;
                          uVar20 = uVar20 - 1;
                        } while (iVar13 != 8);
                      }
                      break;
                    }
                    pMVar8 = *local_60;
                    uVar20 = 7;
                    do {
                      pMVar8[(int)track].bitfield[index] = (bVar2 >> (uVar20 & 0x1f) & 1) != 0;
                      index = index + 1;
                      pMVar8 = *local_60;
                      if (pMVar8[(int)track].size <= index) {
                        index = 0;
                      }
                      bVar23 = uVar20 != 0;
                      uVar20 = uVar20 - 1;
                    } while (bVar23);
                  }
                  else {
                    if (iVar14 < 8) {
                      index = IDisk::AddByteToSpecificTrack
                                        (local_88,(int)local_98,track,index,bVar2,iVar14 * 2);
                      break;
                    }
                    index = IDisk::AddByteToSpecificTrack
                                      (local_88,(int)local_98,track,index,bVar2,0x10);
                  }
                }
              }
            }
            lVar10 = (long)iVar6;
            iVar6 = iVar6 + 1;
            bVar9 = local_78[lVar10];
          } while (bVar9 != 0);
        }
        this_00 = local_88;
        uVar20 = local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 | (local_4c & 0xff00) << 8 |
                 local_4c << 0x18;
        iVar6 = (int)local_98;
        if (local_58->encoder_type_ == 1) {
          if (uVar20 != 0) {
            uVar12 = 0;
            do {
              uVar18 = uVar20 - uVar12;
              uVar17 = 0x10;
              if (uVar18 < 0x10) {
                uVar12 = uVar20;
                uVar17 = uVar18;
              }
              index = IDisk::AddByteToSpecificTrack(this_00,iVar6,track,index,byte,uVar17);
              uVar12 = uVar12 + 0x10;
            } while (uVar12 < uVar20);
          }
        }
        else {
          uVar17 = (uint)local_a0 * 2 + (uint)local_a8 * 2;
          uVar12 = (uint)local_a8;
          if (uVar20 < uVar17) {
LAB_00146d84:
            uVar18 = uVar20 + (uint)local_a8 * -2 >> 1;
            local_a0 = CONCAT44(local_a0._4_4_,uVar18);
          }
          else {
            uVar18 = (uint)local_a0;
            if (uVar17 < uVar20) {
              bVar16 = (uint)local_a8 == 0 & (byte)local_7c;
              if ((char)local_90 == '\x01' && (uint)local_a0 == 0) {
                if (bVar16 == 0) goto LAB_00146d84;
                local_a0 = CONCAT44(local_a0._4_4_,uVar20 >> 2);
                uVar18 = uVar20 >> 2;
              }
              else if (bVar16 == 0) goto LAB_00146dde;
              uVar12 = uVar20 + uVar18 * -2 >> 1;
              local_a8 = CONCAT44(local_a8._4_4_,uVar12);
            }
          }
LAB_00146dde:
          uVar11 = local_a8;
          if ((char)local_90 != '\0') {
            if (uVar18 == 0) {
              if (uVar12 == 0) {
                uVar18 = uVar20 >> 2;
                local_a8 = CONCAT44(local_a8._4_4_,uVar18);
                uVar7 = local_a8;
                local_a0 = CONCAT44(local_a0._4_4_,uVar18);
                local_a8._6_2_ = SUB82(uVar11,6);
                local_a8._0_6_ = CONCAT15(byte,(int5)uVar7);
                uVar12 = uVar18;
              }
              else {
                uVar18 = (uVar20 >> 1) - uVar12;
                local_a0 = CONCAT44(local_a0._4_4_,uVar18);
              }
            }
            uVar17 = uVar18 * 2;
            if (uVar17 != 0) {
              uVar12 = 0;
              do {
                if (uVar17 - uVar12 < 0x10) {
                  index = IDisk::AddByteToSpecificTrack
                                    (this_00,iVar6,track,index,local_a0._5_1_,uVar17 - uVar12);
                  uVar12 = (uint)local_a0 * 2;
                  uVar18 = (uint)local_a0;
                }
                else if (local_a0._4_1_ == '\b') {
                  index = IDisk::AddByteToSpecificTrack
                                    (this_00,iVar6,track,index,local_a0._5_1_,0x10);
                  uVar18 = (uint)local_a0;
                }
                uVar12 = uVar12 + 0x10;
                uVar17 = uVar18 * 2;
              } while (uVar12 < uVar17);
              uVar12 = (uint)local_a8;
            }
          }
          iVar6 = uVar20 + (uVar12 + uVar18) * -2;
          if (((uVar12 + uVar18) * 2 <= uVar20 && iVar6 != 0) && (0 < iVar6)) {
            iVar13 = 0x10;
            iVar14 = 0;
            iVar21 = 0;
            do {
              iVar19 = iVar6;
              if (iVar13 < iVar6) {
                iVar19 = iVar13;
              }
              iVar21 = iVar21 + 0x10;
              index = IDisk::AddByteToSpecificTrack
                                (this_00,(int)local_98,track,index,'N',iVar19 + iVar14);
              iVar13 = iVar13 + 0x10;
              iVar14 = iVar14 + -0x10;
            } while (iVar21 < iVar6);
          }
          if ((byte)local_7c != '\0') {
            uVar20 = (uint)local_a8 & 7;
            iVar6 = (int)local_98;
            uVar12 = (uint)local_a8;
            if ((local_a8 & 7) != 0) {
              index = IDisk::AddByteToSpecificTrack(this_00,iVar6,track,index,local_a8._5_1_,uVar20)
              ;
              uVar12 = (uint)local_a8;
            }
            for (; uVar20 < uVar12 * 2; uVar20 = uVar20 + 0x10) {
              uVar17 = uVar12 * 2 - uVar20;
              if (uVar17 < 0x10) {
                index = IDisk::AddByteToSpecificTrack
                                  (this_00,iVar6,track,index,local_a8._5_1_,uVar17);
                uVar20 = (uint)local_a8 * 2;
                uVar12 = (uint)local_a8;
              }
              else if (local_a8._4_1_ == '\b') {
                index = IDisk::AddByteToSpecificTrack(this_00,iVar6,track,index,local_a8._5_1_,0x10)
                ;
                uVar12 = (uint)local_a8;
              }
            }
          }
        }
        local_44 = local_44 + 0x20;
        local_48 = local_48 + 1;
        if (local_48 == local_50) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool CAPSFile::DecodeData(DataChunks item, IDisk* disk)
{
   unsigned int offset = 0;
   unsigned char* block = item.buffer;
   unsigned char* data_block = &block[offset];

   int total_total = 0;
   // Now, extra data blocks ?
   if (item.size != 0)
   {
      // Get block count from IMGE
      ImgeItem imge_item;
      bool found = false;
      for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end() && (!found); it++)
      {
         if (it->data_key == item.data_id)
         {
            // Found !
            imge_item = *it;
            found = true;
         }
      }
      if (!found || (imge_item.block_count * 32 > item.size))
      {
         // Error !
         return false;
         // TODO : Save this chunk for later use ?
         //break;
      }
      else
      {
         int total_data = 0;

         unsigned int index_track = imge_item.start_bit_pos;
         for (DWORD i = 0; i < imge_item.block_count; i++)
         {
            // Read descriptors
            int data_bits = ExtractInt(&block[offset]);
            offset += 4;
            unsigned int gap_bits = ExtractInt(&block[offset]);
            offset += 4;
            int data_bytes = 0;
            int gap_bytes = 0;
            unsigned int gap_offset = 0;
            int cell_type = 0;
            if (encoder_type_ == 1)
            {
               data_bytes = ExtractInt(&block[offset]);
               offset += 4;
               gap_bytes = ExtractInt(&block[offset]);
               offset += 4;
            }
            else
            {
               gap_offset = ExtractInt(&block[offset]);
               offset += 4;
               cell_type = ExtractInt(&block[offset]);
               offset += 4;
            }
            int encoder_type = ExtractInt(&block[offset]);
            offset += 4;
            int block_flags = ExtractInt(&block[offset]);
            offset += 4;
            int gap_default = ExtractInt(&block[offset]);
            offset += 4;
            int data_offset = ExtractInt(&block[offset]);
            offset += 4;

            // Now, remaining datas
            unsigned char* current_block_gap = &data_block[gap_offset];
            unsigned char* current_block_data = &data_block[data_offset];
            data_offset = 0;
            gap_offset = 0;
            // Do we have backward gap ?
            // Read Forward / Backward streams
            StreamItem backward_stream = {0};
            StreamItem forward_stream = {0};

            unsigned int total_gap = 0;
            bool forward_gap = false;
            bool backward_gap = false;
            if ((block_flags & 0x1) == 0x1)
            {
               // Ok, Forward stream
               forward_gap = GetStreamGapItem(&forward_stream, current_block_gap, gap_offset, item.size);
            }
            if ((block_flags & 0x2) == 0x2)
            {
               // Ok, backward stream
               backward_gap = GetStreamGapItem(&backward_stream, current_block_gap, gap_offset, item.size);
            }

            // data
            unsigned char b = current_block_data[data_offset++];
            unsigned int offset_before = index_track;
            while (b != 0)
            {
               int size_width = b >> 5;
               int data_type = b & 0x1F;
               int data_size = 0;
               for (int j = 0; j < size_width; j++)
               {
                  data_size += (current_block_data[data_offset++] << (8 * (size_width - (j + 1))));
               }
               if ((block_flags & 0x4) == 0x4)
               {
                  // in bits
                  while (data_size != 0)
                  {
                     if (data_type == 5)
                     {
                        for (int c = 0; c < data_size; c++)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        data_size = 0;
                     }
                     else
                     {
                        unsigned char bitfield = current_block_data[data_offset++];
                        if (data_type == 1)
                        {
                           if (data_size > 8)
                           {
                              int maxbits = 8;
                              for (int d = 0; d < 8; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size -= 8;
                           }
                           else
                           {
                              int maxbits = 8;
                              for (int d = 0; d < data_size; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size = 0;
                           }
                        }
                           // in bytes
                        else
                        {
                           // Convert to MFM
                           if (data_size >= 8)
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield);
                              data_size -= 8;
                           }
                           else
                           {
                              // Convert to MFM
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield, data_size * 2);
                              data_size -= data_size;
                           }
                        }
                     }
                  }
               }
               else
               {
                  // in bytes
                  if (data_type == 5)
                  {
                     // weak bit ??
                     unsigned char byte = 0xE5;

                     for (int c = 0; c < data_size * 16; c++)
                     {
                        if (c > 256 * 16 || data_size != 512)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, byte);
                           c += 15;
                        }
                     }
                     //dataoffset++;
                  }
                  else
                  {
                     if (data_type == 3)
                     {
                        //totalGap += dataSize*16;
                     }
                     for (int c = 0; c < data_size; c++)
                     {
                        unsigned char byte = 0;
                        {
                           byte = current_block_data[data_offset++];

                           if (data_type == 1)
                           {
                              index_track = disk->AddMFMByteToAllTrack(imge_item.side, imge_item.track_number,
                                                                       index_track, byte, 8);
                           }
                           else
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, byte);
                           }
                        }
                     }
                  }
               }
               b = current_block_data[data_offset++];
            }
            if (offset_before > index_track)
            {
               offset_before = offset_before - disk->side_[imge_item.side].tracks[imge_item.track_number].size;
            }
            total_total += data_bits; //indexTrack - offsetBefore;
            total_data += data_bits;
            if ((data_bits != index_track - offset_before)
               && ((index_track != offset_before)
                  || (data_bits != disk->side_[imge_item.side].tracks[imge_item.track_number].size)
               )
            )
            {
               //
               int dbg = 1;
            }


            if (encoder_type_ == 1)
            {
               // GAP via CAPS encoding
               for (unsigned int c = 0; c < gap_bits; c += 16)
               {
                  if (gap_bits - c < 16)
                  {
                     // Add what we need to
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                gap_default, (gap_bits - c));

                     // then quit
                     total_gap += gap_bits - c;
                     c = gap_bits;
                  }
                  else
                  {
                     {
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   gap_default);

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {

                        }

                        total_gap += 16;
                     }
                  }
               }
            }
            else
            {
               if (forward_stream.size * 2 + backward_stream.size * 2 > gap_bits)
               {
                  // Remove from forward
                  forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
               }
               else
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     // Adjust :
                     //
                     if (forward_gap && forward_stream.size == 0)
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           forward_stream.size = gap_bits / 4;
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                        else
                        {
                           forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
                        }
                     }
                     else
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                     }
                  }
               }
               if (forward_gap)
               {
                  if (forward_stream.size == 0)
                  {
                     if (backward_stream.size != 0)
                     {
                        forward_stream.size = gap_bits / 2 - backward_stream.size;
                     }
                     else
                     {
                        forward_stream.size = backward_stream.size = gap_bits / 4;
                        backward_stream.sample = gap_default;
                     }
                     //forwardStream.Sample = gapDefault;
                  }
                  for (unsigned int c = 0; c < forward_stream.size * 2; c += 16)
                  {
                     if (forward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   forward_stream.sample,
                                                                   (forward_stream.size * 2 - c));

                        // then quit
                        total_gap += forward_stream.size * 2 - c;
                        c = forward_stream.size * 2;
                     }
                     else
                     {
                        if (forward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, forward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
               // Between these two :
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     int nb_bytes = (gap_bits - (forward_stream.size * 2 + backward_stream.size * 2));
                     for (int gp = 0; gp < nb_bytes; gp += 16)
                     {
                        if (gp + 16 > nb_bytes)
                        {
                           // Add what we need to
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E, (nb_bytes - gp));

                           // then quit
                           total_gap += nb_bytes - gp;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E);
                           total_gap += 16;
                        }

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {
                        }
                     }
                  }
               }

               // Backward stream ?
               if (backward_gap)
               {
                  // First byte (or any part of it)
                  unsigned int c = 0;
                  if (backward_stream.size % 8 != 0)
                  {
                     // TODO
                     c = backward_stream.size % 8;
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                backward_stream.sample, c);
                  }
                  for (; c < backward_stream.size * 2; c += 16)
                  {
                     if (backward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   backward_stream.sample,
                                                                   (backward_stream.size * 2 - c));

                        // then quit
                        total_gap += backward_stream.size * 2 - c;
                        c = backward_stream.size * 2;
                     }
                     else
                     {
                        if (backward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, backward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
            }
            if (total_gap != gap_bits)
            {
            }
            //else
            total_total += total_gap;
         }

         // Check index / size
         if (index_track != imge_item.start_bit_pos || total_total != disk->side_[imge_item.side].tracks[imge_item.
            track_number].size)
         {
         }
      }
   }

   return true;
}